

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

p_ply ply_open_from_file(FILE *fp,p_ply_error_cb error_cb,long idata,void *pdata)

{
  int iVar1;
  p_ply ply;
  void *pdata_local;
  long idata_local;
  p_ply_error_cb error_cb_local;
  FILE *fp_local;
  
  idata_local = (long)error_cb;
  if (error_cb == (p_ply_error_cb)0x0) {
    idata_local = (long)ply_error_cb;
  }
  if (fp != (FILE *)0x0) {
    iVar1 = ply_type_check();
    if (iVar1 == 0) {
      (*(code *)idata_local)(0,"Incompatible type system");
      fp_local = (FILE *)0x0;
    }
    else {
      fp_local = (FILE *)ply_alloc();
      if ((p_ply)fp_local == (p_ply)0x0) {
        (*(code *)idata_local)(0,"Out of memory");
        fp_local = (FILE *)0x0;
      }
      else {
        ((p_ply)fp_local)->idata = idata;
        ((p_ply)fp_local)->pdata = pdata;
        ((p_ply)fp_local)->io_mode = PLY_READ;
        ((p_ply)fp_local)->error_cb = (p_ply_error_cb)idata_local;
        ((p_ply)fp_local)->fp = fp;
        ((p_ply)fp_local)->own_fp = 0;
      }
    }
    return (p_ply)fp_local;
  }
  __assert_fail("fp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x17c,"p_ply ply_open_from_file(FILE *, p_ply_error_cb, long, void *)");
}

Assistant:

p_ply ply_open_from_file(FILE *fp, p_ply_error_cb error_cb,
        long idata, void *pdata) {
    p_ply ply = NULL;
    if (error_cb == NULL) error_cb = ply_error_cb;
    assert(fp);
    if (!ply_type_check()) {
        error_cb(ply, "Incompatible type system");
        return NULL;
    }
    ply = ply_alloc();
    if (!ply) {
        error_cb(NULL, "Out of memory");
        return NULL;
    }
    ply->idata = idata;
    ply->pdata = pdata;
    ply->io_mode = PLY_READ;
    ply->error_cb = error_cb;
    ply->fp = fp;
    ply->own_fp = 0;
    return ply;
}